

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall DepfileParserTestBasic::Run(DepfileParserTestBasic *this)

{
  Test *pTVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  string local_60;
  undefined4 local_40;
  undefined1 local_30 [8];
  string err;
  DepfileParserTestBasic *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  bVar2 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,
                     "build/ninja.o: ninja.cc ninja.h eval_env.h manifest_parser.h\n",
                     (string *)local_30);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
             ,0x25,
             "Parse( \"build/ninja.o: ninja.cc ninja.h eval_env.h manifest_parser.h\\n\", &err)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                     ,0x26,"\"\" == err");
  pTVar1 = g_current_test;
  if (bVar2) {
    sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                      (&(this->super_DepfileParserTest).parser_.outs_);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar3 == 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                       ,0x27,"1u == parser_.outs_.size()");
    pTVar1 = g_current_test;
    if (bVar2) {
      this_00 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                          (&(this->super_DepfileParserTest).parser_.outs_,0);
      StringPiece::AsString_abi_cxx11_(&local_60,this_00);
      bVar2 = std::operator==("build/ninja.o",&local_60);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                 ,0x28,"\"build/ninja.o\" == parser_.outs_[0].AsString()");
      std::__cxx11::string::~string((string *)&local_60);
      pTVar1 = g_current_test;
      sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size
                        (&(this->super_DepfileParserTest).parser_.ins_);
      testing::Test::Check
                (pTVar1,sVar3 == 4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/depfile_parser_test.cc"
                 ,0x29,"4u == parser_.ins_.size()");
      local_40 = 0;
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_40 = 1;
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    local_40 = 1;
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(DepfileParserTest, Basic) {
  string err;
  EXPECT_TRUE(Parse(
"build/ninja.o: ninja.cc ninja.h eval_env.h manifest_parser.h\n",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("build/ninja.o", parser_.outs_[0].AsString());
  EXPECT_EQ(4u, parser_.ins_.size());
}